

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nike.cpp
# Opt level: O1

void __thiscall NikeShoes::Show(NikeShoes *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_cb51,0x17)
  ;
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,(this->super_Shoes).param_.size);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_3e5c,0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->super_Shoes).param_.color._M_dataplus._M_p,
                      (this->super_Shoes).param_.color._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void NikeShoes::Show() {
    std::cout << "耐克球鞋, 大小："<<this->param_.size<<", 颜色："<<this->param_.color<<std::endl;
}